

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp4::compute
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix)

{
  int in_stack_0000001c;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000020;
  int in_stack_0000002c;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000030;
  int in_stack_0000003c;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000040;
  int in_stack_0000004c;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000050;
  int in_stack_0000005c;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000060;
  int in_stack_0000006c;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000070;
  int in_stack_0000007c;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000080;
  int in_stack_0000008c;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000090;
  int in_stack_0000009c;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_000000a0;
  int in_stack_000000ac;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_000000b0;
  int in_stack_000000bc;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_000000c0;
  int in_stack_000000cc;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_000000d0;
  int in_stack_000000dc;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_000000e0;
  int in_stack_000000ec;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_000000f0;
  int in_stack_000000fc;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000100;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000120;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000140;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000150;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000160;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000170;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_00000180;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_000001a0;
  Matrix<double,_25,_37,_0,_25,_37> *in_stack_000001b0;
  
  sPolynomial5(in_stack_000001b0);
  sPolynomial6(in_stack_000001b0);
  groebnerRow5_0000_f(in_stack_000000e0,in_stack_000000dc);
  sPolynomial7(in_stack_000001b0);
  groebnerRow5_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0000_f(in_stack_000000d0,in_stack_000000cc);
  sPolynomial8(in_stack_000001b0);
  groebnerRow5_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0000_f(in_stack_000000c0,in_stack_000000bc);
  sPolynomial9(in_stack_00000150);
  groebnerRow7_0100_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0100_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow5_1000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_1000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow5_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0000_f(in_stack_000000b0,in_stack_000000ac);
  sPolynomial10(in_stack_00000170);
  groebnerRow6_0100_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0100_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0100_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow9_0000_f(in_stack_00000100,in_stack_000000fc);
  groebnerRow5_1000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_1000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow5_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0000_f(in_stack_000000b0,in_stack_000000ac);
  sPolynomial11(in_stack_00000160);
  groebnerRow6_0100_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0100_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0100_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow9_0000_f(in_stack_00000100,in_stack_000000fc);
  groebnerRow4_1000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_1000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_1000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow10_0000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow4_0000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0000_f(in_stack_000000b0,in_stack_000000ac);
  sPolynomial12(in_stack_00000180);
  groebnerRow5_0100_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0100_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0100_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0100_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow9_0000_f(in_stack_00000100,in_stack_000000fc);
  groebnerRow4_1000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_1000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_1000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow10_0000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow11_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow4_0000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0000_f(in_stack_000000b0,in_stack_000000ac);
  sPolynomial13(in_stack_00000180);
  groebnerRow6_0010_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow4_0100_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_0100_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0100_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0100_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0100_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow9_0000_f(in_stack_00000100,in_stack_000000fc);
  groebnerRow4_1000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_1000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_1000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow10_0000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow11_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow12_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow4_0000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0000_f(in_stack_000000b0,in_stack_000000ac);
  sPolynomial14(in_stack_000001a0);
  groebnerRow5_0010_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0010_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow4_0100_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_0100_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0100_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0100_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0100_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow9_0000_f(in_stack_00000100,in_stack_000000fc);
  groebnerRow4_1000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_1000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_1000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow10_0000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow11_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow12_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow13_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow4_0000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0000_f(in_stack_000000b0,in_stack_000000ac);
  sPolynomial15(in_stack_00000140);
  groebnerRow14_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow9_0000_f(in_stack_00000100,in_stack_000000fc);
  groebnerRow7_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow10_0000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow11_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow12_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow13_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow14_0000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow7_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0000_f(in_stack_000000b0,in_stack_000000ac);
  sPolynomial16(in_stack_00000150);
  groebnerRow13_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow14_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow8_0100_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow15_0100_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow5_1000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_1000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow15_1000_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow11_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow12_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow13_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow14_0000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow5_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow15_0000_f(in_stack_000000a0,in_stack_0000009c);
  sPolynomial17(in_stack_00000160);
  groebnerRow12_1000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow13_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow14_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow7_0100_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0100_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow15_0100_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow4_1000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_1000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_1000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow15_1000_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow16_1000_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow12_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow13_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow14_0000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow4_0000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow15_0000_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow16_0000_f(in_stack_00000090,in_stack_0000008c);
  sPolynomial18(in_stack_00000180);
  groebnerRow14_0001_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow14_0010_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow13_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow14_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow7_0100_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0100_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow15_0100_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow4_1000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_1000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_1000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_1000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_1000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow15_1000_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow16_1000_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow17_1000_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow13_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow14_0000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow4_0000_f(in_stack_000000f0,in_stack_000000ec);
  groebnerRow5_0000_f(in_stack_000000e0,in_stack_000000dc);
  groebnerRow6_0000_f(in_stack_000000d0,in_stack_000000cc);
  groebnerRow7_0000_f(in_stack_000000c0,in_stack_000000bc);
  groebnerRow8_0000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow15_0000_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow16_0000_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow17_0000_f(in_stack_00000080,in_stack_0000007c);
  sPolynomial19(in_stack_00000100);
  groebnerRow14_0000_f(in_stack_000000b0,in_stack_000000ac);
  groebnerRow15_0000_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow16_0000_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow17_0000_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow18_0000_f(in_stack_00000070,in_stack_0000006c);
  sPolynomial20(in_stack_00000120);
  groebnerRow18_1000_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow19_1000_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow15_0000_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow16_0000_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow17_0000_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow18_0000_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow19_0000_f(in_stack_00000060,in_stack_0000005c);
  sPolynomial21(in_stack_00000140);
  groebnerRow17_1000_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow18_1000_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow19_1000_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow15_0000_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow20_1000_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow17_0000_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow18_0000_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow19_0000_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow20_0000_f(in_stack_00000050,in_stack_0000004c);
  sPolynomial22(in_stack_00000160);
  groebnerRow19_0001_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow19_0010_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow18_1000_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow19_1000_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow20_0001_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow20_0010_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow21_0010_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow20_0100_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow21_0100_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow15_0000_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow20_1000_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow21_1000_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow18_0000_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow19_0000_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow20_0000_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow21_0000_f(in_stack_00000040,in_stack_0000003c);
  sPolynomial23(in_stack_00000170);
  groebnerRow20_1100_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow21_1100_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow22_1100_f(in_stack_00000030,in_stack_0000002c);
  groebnerRow19_0001_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow19_0010_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow19_0100_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow19_1000_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow20_0001_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow20_0010_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow21_0010_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow20_0100_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow21_0100_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow22_0100_f(in_stack_00000030,in_stack_0000002c);
  groebnerRow20_1000_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow21_1000_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow22_1000_f(in_stack_00000030,in_stack_0000002c);
  groebnerRow19_0000_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow20_0000_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow21_0000_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow22_0000_f(in_stack_00000030,in_stack_0000002c);
  sPolynomial24(in_stack_00000050);
  groebnerRow20_0000_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow21_0000_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow22_0000_f(in_stack_00000030,in_stack_0000002c);
  groebnerRow23_0000_f(in_stack_00000020,in_stack_0000001c);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::compute(
    Eigen::Matrix<double,25,37> & groebnerMatrix )
{
  sPolynomial5(groebnerMatrix);

  sPolynomial6(groebnerMatrix);
  groebnerRow5_0000_f(groebnerMatrix,6);

  sPolynomial7(groebnerMatrix);
  groebnerRow5_0000_f(groebnerMatrix,7);
  groebnerRow6_0000_f(groebnerMatrix,7);

  sPolynomial8(groebnerMatrix);
  groebnerRow5_0000_f(groebnerMatrix,8);
  groebnerRow6_0000_f(groebnerMatrix,8);
  groebnerRow7_0000_f(groebnerMatrix,8);

  sPolynomial9(groebnerMatrix);
  groebnerRow7_0100_f(groebnerMatrix,9);
  groebnerRow8_0100_f(groebnerMatrix,9);
  groebnerRow5_1000_f(groebnerMatrix,9);
  groebnerRow6_1000_f(groebnerMatrix,9);
  groebnerRow7_1000_f(groebnerMatrix,9);
  groebnerRow8_1000_f(groebnerMatrix,9);
  groebnerRow5_0000_f(groebnerMatrix,9);
  groebnerRow6_0000_f(groebnerMatrix,9);
  groebnerRow7_0000_f(groebnerMatrix,9);
  groebnerRow8_0000_f(groebnerMatrix,9);

  sPolynomial10(groebnerMatrix);
  groebnerRow6_0100_f(groebnerMatrix,10);
  groebnerRow7_0100_f(groebnerMatrix,10);
  groebnerRow8_0100_f(groebnerMatrix,10);
  groebnerRow9_0000_f(groebnerMatrix,10);
  groebnerRow5_1000_f(groebnerMatrix,10);
  groebnerRow6_1000_f(groebnerMatrix,10);
  groebnerRow7_1000_f(groebnerMatrix,10);
  groebnerRow8_1000_f(groebnerMatrix,10);
  groebnerRow5_0000_f(groebnerMatrix,10);
  groebnerRow6_0000_f(groebnerMatrix,10);
  groebnerRow7_0000_f(groebnerMatrix,10);
  groebnerRow8_0000_f(groebnerMatrix,10);

  sPolynomial11(groebnerMatrix);
  groebnerRow6_0100_f(groebnerMatrix,11);
  groebnerRow7_0100_f(groebnerMatrix,11);
  groebnerRow8_0100_f(groebnerMatrix,11);
  groebnerRow9_0000_f(groebnerMatrix,11);
  groebnerRow4_1000_f(groebnerMatrix,11);
  groebnerRow5_1000_f(groebnerMatrix,11);
  groebnerRow6_1000_f(groebnerMatrix,11);
  groebnerRow7_1000_f(groebnerMatrix,11);
  groebnerRow8_1000_f(groebnerMatrix,11);
  groebnerRow10_0000_f(groebnerMatrix,11);
  groebnerRow4_0000_f(groebnerMatrix,11);
  groebnerRow5_0000_f(groebnerMatrix,11);
  groebnerRow6_0000_f(groebnerMatrix,11);
  groebnerRow7_0000_f(groebnerMatrix,11);
  groebnerRow8_0000_f(groebnerMatrix,11);

  sPolynomial12(groebnerMatrix);
  groebnerRow5_0100_f(groebnerMatrix,12);
  groebnerRow6_0100_f(groebnerMatrix,12);
  groebnerRow7_0100_f(groebnerMatrix,12);
  groebnerRow8_0100_f(groebnerMatrix,12);
  groebnerRow9_0000_f(groebnerMatrix,12);
  groebnerRow4_1000_f(groebnerMatrix,12);
  groebnerRow5_1000_f(groebnerMatrix,12);
  groebnerRow6_1000_f(groebnerMatrix,12);
  groebnerRow7_1000_f(groebnerMatrix,12);
  groebnerRow8_1000_f(groebnerMatrix,12);
  groebnerRow10_0000_f(groebnerMatrix,12);
  groebnerRow11_0000_f(groebnerMatrix,12);
  groebnerRow4_0000_f(groebnerMatrix,12);
  groebnerRow5_0000_f(groebnerMatrix,12);
  groebnerRow6_0000_f(groebnerMatrix,12);
  groebnerRow7_0000_f(groebnerMatrix,12);
  groebnerRow8_0000_f(groebnerMatrix,12);

  sPolynomial13(groebnerMatrix);
  groebnerRow6_0010_f(groebnerMatrix,13);
  groebnerRow4_0100_f(groebnerMatrix,13);
  groebnerRow5_0100_f(groebnerMatrix,13);
  groebnerRow6_0100_f(groebnerMatrix,13);
  groebnerRow7_0100_f(groebnerMatrix,13);
  groebnerRow8_0100_f(groebnerMatrix,13);
  groebnerRow9_0000_f(groebnerMatrix,13);
  groebnerRow4_1000_f(groebnerMatrix,13);
  groebnerRow5_1000_f(groebnerMatrix,13);
  groebnerRow6_1000_f(groebnerMatrix,13);
  groebnerRow7_1000_f(groebnerMatrix,13);
  groebnerRow8_1000_f(groebnerMatrix,13);
  groebnerRow10_0000_f(groebnerMatrix,13);
  groebnerRow11_0000_f(groebnerMatrix,13);
  groebnerRow12_0000_f(groebnerMatrix,13);
  groebnerRow4_0000_f(groebnerMatrix,13);
  groebnerRow5_0000_f(groebnerMatrix,13);
  groebnerRow6_0000_f(groebnerMatrix,13);
  groebnerRow7_0000_f(groebnerMatrix,13);
  groebnerRow8_0000_f(groebnerMatrix,13);

  sPolynomial14(groebnerMatrix);
  groebnerRow5_0010_f(groebnerMatrix,14);
  groebnerRow6_0010_f(groebnerMatrix,14);
  groebnerRow4_0100_f(groebnerMatrix,14);
  groebnerRow5_0100_f(groebnerMatrix,14);
  groebnerRow6_0100_f(groebnerMatrix,14);
  groebnerRow7_0100_f(groebnerMatrix,14);
  groebnerRow8_0100_f(groebnerMatrix,14);
  groebnerRow9_0000_f(groebnerMatrix,14);
  groebnerRow4_1000_f(groebnerMatrix,14);
  groebnerRow5_1000_f(groebnerMatrix,14);
  groebnerRow6_1000_f(groebnerMatrix,14);
  groebnerRow7_1000_f(groebnerMatrix,14);
  groebnerRow8_1000_f(groebnerMatrix,14);
  groebnerRow10_0000_f(groebnerMatrix,14);
  groebnerRow11_0000_f(groebnerMatrix,14);
  groebnerRow12_0000_f(groebnerMatrix,14);
  groebnerRow13_0000_f(groebnerMatrix,14);
  groebnerRow4_0000_f(groebnerMatrix,14);
  groebnerRow5_0000_f(groebnerMatrix,14);
  groebnerRow6_0000_f(groebnerMatrix,14);
  groebnerRow7_0000_f(groebnerMatrix,14);
  groebnerRow8_0000_f(groebnerMatrix,14);

  sPolynomial15(groebnerMatrix);
  groebnerRow14_1000_f(groebnerMatrix,15);
  groebnerRow9_0000_f(groebnerMatrix,15);
  groebnerRow7_1000_f(groebnerMatrix,15);
  groebnerRow8_1000_f(groebnerMatrix,15);
  groebnerRow10_0000_f(groebnerMatrix,15);
  groebnerRow11_0000_f(groebnerMatrix,15);
  groebnerRow12_0000_f(groebnerMatrix,15);
  groebnerRow13_0000_f(groebnerMatrix,15);
  groebnerRow14_0000_f(groebnerMatrix,15);
  groebnerRow7_0000_f(groebnerMatrix,15);
  groebnerRow8_0000_f(groebnerMatrix,15);

  sPolynomial16(groebnerMatrix);
  groebnerRow13_1000_f(groebnerMatrix,16);
  groebnerRow14_1000_f(groebnerMatrix,16);
  groebnerRow8_0100_f(groebnerMatrix,16);
  groebnerRow15_0100_f(groebnerMatrix,16);
  groebnerRow5_1000_f(groebnerMatrix,16);
  groebnerRow6_1000_f(groebnerMatrix,16);
  groebnerRow7_1000_f(groebnerMatrix,16);
  groebnerRow8_1000_f(groebnerMatrix,16);
  groebnerRow15_1000_f(groebnerMatrix,16);
  groebnerRow11_0000_f(groebnerMatrix,16);
  groebnerRow12_0000_f(groebnerMatrix,16);
  groebnerRow13_0000_f(groebnerMatrix,16);
  groebnerRow14_0000_f(groebnerMatrix,16);
  groebnerRow5_0000_f(groebnerMatrix,16);
  groebnerRow6_0000_f(groebnerMatrix,16);
  groebnerRow7_0000_f(groebnerMatrix,16);
  groebnerRow8_0000_f(groebnerMatrix,16);
  groebnerRow15_0000_f(groebnerMatrix,16);

  sPolynomial17(groebnerMatrix);
  groebnerRow12_1000_f(groebnerMatrix,17);
  groebnerRow13_1000_f(groebnerMatrix,17);
  groebnerRow14_1000_f(groebnerMatrix,17);
  groebnerRow7_0100_f(groebnerMatrix,17);
  groebnerRow8_0100_f(groebnerMatrix,17);
  groebnerRow15_0100_f(groebnerMatrix,17);
  groebnerRow4_1000_f(groebnerMatrix,17);
  groebnerRow5_1000_f(groebnerMatrix,17);
  groebnerRow6_1000_f(groebnerMatrix,17);
  groebnerRow7_1000_f(groebnerMatrix,17);
  groebnerRow8_1000_f(groebnerMatrix,17);
  groebnerRow15_1000_f(groebnerMatrix,17);
  groebnerRow16_1000_f(groebnerMatrix,17);
  groebnerRow12_0000_f(groebnerMatrix,17);
  groebnerRow13_0000_f(groebnerMatrix,17);
  groebnerRow14_0000_f(groebnerMatrix,17);
  groebnerRow4_0000_f(groebnerMatrix,17);
  groebnerRow5_0000_f(groebnerMatrix,17);
  groebnerRow6_0000_f(groebnerMatrix,17);
  groebnerRow7_0000_f(groebnerMatrix,17);
  groebnerRow8_0000_f(groebnerMatrix,17);
  groebnerRow15_0000_f(groebnerMatrix,17);
  groebnerRow16_0000_f(groebnerMatrix,17);

  sPolynomial18(groebnerMatrix);
  groebnerRow14_0001_f(groebnerMatrix,18);
  groebnerRow14_0010_f(groebnerMatrix,18);
  groebnerRow13_1000_f(groebnerMatrix,18);
  groebnerRow14_1000_f(groebnerMatrix,18);
  groebnerRow7_0100_f(groebnerMatrix,18);
  groebnerRow8_0100_f(groebnerMatrix,18);
  groebnerRow15_0100_f(groebnerMatrix,18);
  groebnerRow4_1000_f(groebnerMatrix,18);
  groebnerRow5_1000_f(groebnerMatrix,18);
  groebnerRow6_1000_f(groebnerMatrix,18);
  groebnerRow7_1000_f(groebnerMatrix,18);
  groebnerRow8_1000_f(groebnerMatrix,18);
  groebnerRow15_1000_f(groebnerMatrix,18);
  groebnerRow16_1000_f(groebnerMatrix,18);
  groebnerRow17_1000_f(groebnerMatrix,18);
  groebnerRow13_0000_f(groebnerMatrix,18);
  groebnerRow14_0000_f(groebnerMatrix,18);
  groebnerRow4_0000_f(groebnerMatrix,18);
  groebnerRow5_0000_f(groebnerMatrix,18);
  groebnerRow6_0000_f(groebnerMatrix,18);
  groebnerRow7_0000_f(groebnerMatrix,18);
  groebnerRow8_0000_f(groebnerMatrix,18);
  groebnerRow15_0000_f(groebnerMatrix,18);
  groebnerRow16_0000_f(groebnerMatrix,18);
  groebnerRow17_0000_f(groebnerMatrix,18);

  sPolynomial19(groebnerMatrix);
  groebnerRow14_0000_f(groebnerMatrix,19);
  groebnerRow15_0000_f(groebnerMatrix,19);
  groebnerRow16_0000_f(groebnerMatrix,19);
  groebnerRow17_0000_f(groebnerMatrix,19);
  groebnerRow18_0000_f(groebnerMatrix,19);

  sPolynomial20(groebnerMatrix);
  groebnerRow18_1000_f(groebnerMatrix,20);
  groebnerRow19_1000_f(groebnerMatrix,20);
  groebnerRow15_0000_f(groebnerMatrix,20);
  groebnerRow16_0000_f(groebnerMatrix,20);
  groebnerRow17_0000_f(groebnerMatrix,20);
  groebnerRow18_0000_f(groebnerMatrix,20);
  groebnerRow19_0000_f(groebnerMatrix,20);

  sPolynomial21(groebnerMatrix);
  groebnerRow17_1000_f(groebnerMatrix,21);
  groebnerRow18_1000_f(groebnerMatrix,21);
  groebnerRow19_1000_f(groebnerMatrix,21);
  groebnerRow15_0000_f(groebnerMatrix,21);
  groebnerRow20_1000_f(groebnerMatrix,21);
  groebnerRow17_0000_f(groebnerMatrix,21);
  groebnerRow18_0000_f(groebnerMatrix,21);
  groebnerRow19_0000_f(groebnerMatrix,21);
  groebnerRow20_0000_f(groebnerMatrix,21);

  sPolynomial22(groebnerMatrix);
  groebnerRow19_0001_f(groebnerMatrix,22);
  groebnerRow19_0010_f(groebnerMatrix,22);
  groebnerRow18_1000_f(groebnerMatrix,22);
  groebnerRow19_1000_f(groebnerMatrix,22);
  groebnerRow20_0001_f(groebnerMatrix,22);
  groebnerRow20_0010_f(groebnerMatrix,22);
  groebnerRow21_0010_f(groebnerMatrix,22);
  groebnerRow20_0100_f(groebnerMatrix,22);
  groebnerRow21_0100_f(groebnerMatrix,22);
  groebnerRow15_0000_f(groebnerMatrix,22);
  groebnerRow20_1000_f(groebnerMatrix,22);
  groebnerRow21_1000_f(groebnerMatrix,22);
  groebnerRow18_0000_f(groebnerMatrix,22);
  groebnerRow19_0000_f(groebnerMatrix,22);
  groebnerRow20_0000_f(groebnerMatrix,22);
  groebnerRow21_0000_f(groebnerMatrix,22);

  sPolynomial23(groebnerMatrix);
  groebnerRow20_1100_f(groebnerMatrix,23);
  groebnerRow21_1100_f(groebnerMatrix,23);
  groebnerRow22_1100_f(groebnerMatrix,23);
  groebnerRow19_0001_f(groebnerMatrix,23);
  groebnerRow19_0010_f(groebnerMatrix,23);
  groebnerRow19_0100_f(groebnerMatrix,23);
  groebnerRow19_1000_f(groebnerMatrix,23);
  groebnerRow20_0001_f(groebnerMatrix,23);
  groebnerRow20_0010_f(groebnerMatrix,23);
  groebnerRow21_0010_f(groebnerMatrix,23);
  groebnerRow20_0100_f(groebnerMatrix,23);
  groebnerRow21_0100_f(groebnerMatrix,23);
  groebnerRow22_0100_f(groebnerMatrix,23);
  groebnerRow20_1000_f(groebnerMatrix,23);
  groebnerRow21_1000_f(groebnerMatrix,23);
  groebnerRow22_1000_f(groebnerMatrix,23);
  groebnerRow19_0000_f(groebnerMatrix,23);
  groebnerRow20_0000_f(groebnerMatrix,23);
  groebnerRow21_0000_f(groebnerMatrix,23);
  groebnerRow22_0000_f(groebnerMatrix,23);

  sPolynomial24(groebnerMatrix);
  groebnerRow20_0000_f(groebnerMatrix,24);
  groebnerRow21_0000_f(groebnerMatrix,24);
  groebnerRow22_0000_f(groebnerMatrix,24);
  groebnerRow23_0000_f(groebnerMatrix,24);

}